

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::cmNinjaTargetGenerator
          (cmNinjaTargetGenerator *this,cmGeneratorTarget *target)

{
  _Rb_tree_header *p_Var1;
  cmLocalNinjaGenerator *pcVar2;
  MacOSXContentGeneratorType *pMVar3;
  
  cmCommonTargetGenerator::cmCommonTargetGenerator
            (&this->super_cmCommonTargetGenerator,HOME_OUTPUT,target);
  (this->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator =
       (_func_int **)&PTR__cmNinjaTargetGenerator_00596708;
  p_Var1 = &(this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header;
  this->MacOSXContentGenerator = (MacOSXContentGeneratorType *)0x0;
  this->OSXBundleGenerator = (cmOSXBundleGenerator *)0x0;
  *(undefined8 *)&(this->MacContentFolders)._M_t._M_impl = 0;
  *(undefined8 *)&(this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar2 = (cmLocalNinjaGenerator *)cmGeneratorTarget::GetLocalGenerator(target);
  this->LocalGenerator = pcVar2;
  (this->Objects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Objects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Objects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CustomCommands).
  super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CustomCommands).
  super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CustomCommands).
  super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar3 = (MacOSXContentGeneratorType *)operator_new(0x10);
  (pMVar3->super_MacOSXContentGeneratorType)._vptr_MacOSXContentGeneratorType =
       (_func_int **)&PTR__MacOSXContentGeneratorType_00596748;
  pMVar3->Generator = this;
  this->MacOSXContentGenerator = pMVar3;
  return;
}

Assistant:

cmNinjaTargetGenerator::cmNinjaTargetGenerator(cmGeneratorTarget* target)
  : cmCommonTargetGenerator(cmOutputConverter::HOME_OUTPUT, target),
    MacOSXContentGenerator(0),
    OSXBundleGenerator(0),
    MacContentFolders(),
    LocalGenerator(
      static_cast<cmLocalNinjaGenerator*>(target->GetLocalGenerator())),
    Objects()
{
  MacOSXContentGenerator = new MacOSXContentGeneratorType(this);
}